

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O1

void __thiscall amrex::FabArrayBase::addThisBD(FabArrayBase *this)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  int iVar4;
  mapped_type_conflict1 *pmVar5;
  
  peVar3 = (this->distributionMap).m_ref.
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->m_bdkey).m_ba_id.data =
       (this->boxarray).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->m_bdkey).m_dm_id.data = peVar3;
  pmVar5 = std::
           map<amrex::FabArrayBase::BDKey,_int,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_int>_>_>
           ::operator[]((map<amrex::FabArrayBase::BDKey,_int,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_int>_>_>
                         *)m_BD_count,&this->m_bdkey);
  iVar2 = *pmVar5;
  iVar1 = iVar2 + 1;
  *pmVar5 = iVar1;
  iVar4 = DAT_00843378;
  if (iVar2 == 0) {
    iVar4 = m_BD_count._40_4_;
    iVar1 = DAT_0084337c;
    if ((int)m_BD_count._40_4_ < DAT_00843378) {
      iVar4 = DAT_00843378;
    }
  }
  else if (iVar1 < DAT_0084337c) {
    iVar1 = DAT_0084337c;
  }
  DAT_0084337c = iVar1;
  DAT_00843378 = iVar4;
  return;
}

Assistant:

void
FabArrayBase::addThisBD ()
{
    m_bdkey = getBDKey();
    int cnt = ++(m_BD_count[m_bdkey]);
    if (cnt == 1) { // new one
        m_FA_stats.recordMaxNumBoxArrays(m_BD_count.size());
    } else {
        m_FA_stats.recordMaxNumBAUse(cnt);
    }
}